

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.h
# Opt level: O3

bool __thiscall
mocker::detail::ValueNumberTable::has(ValueNumberTable *this,shared_ptr<mocker::ir::Addr> *addr)

{
  const_iterator cVar1;
  bool bVar2;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> local_20;
  
  ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
            (&local_20,(Reg *)addr);
  if (local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar2 = true;
  }
  else {
    cVar1 = std::
            _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(key_type *)&local_20);
    bVar2 = cVar1.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_true>
            ._M_cur != (__node_type *)0x0;
  }
  if (local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return bVar2;
}

Assistant:

bool has(const std::shared_ptr<ir::Addr> & addr) const {
    auto reg = ir::dyc<ir::Reg>(addr);
    if (!reg)
      return true;
    return isIn(vn, reg);
  }